

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionTextTest.cpp
# Opt level: O2

void __thiscall CtorExceptionTextTest::CtorExceptionTextTest(CtorExceptionTextTest *this)

{
  allocator<char> local_89;
  char local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  shared_ptr<oout::EqualMatch> local_78;
  shared_ptr<const_oout::NamedTest> local_68;
  char local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<oout::EqualMatch> local_48;
  shared_ptr<const_oout::NamedTest> local_38;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Exception in ctor represent as a text",&local_89);
  std::make_shared<oout::CtorExceptionText<WithException>>();
  std::make_shared<oout::EqualMatch,char_const(&)[12]>((char (*) [12])local_58);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[41],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [41])&local_38,
             (shared_ptr<oout::CtorExceptionText<WithException>_> *)
             "CtorExceptionText is a exception message",&local_48);
  std::make_shared<oout::CtorExceptionText<WithException>,char_const(&)[9]>((char (*) [9])&local_78)
  ;
  std::make_shared<oout::EqualMatch,char_const(&)[9]>((char (*) [9])local_88);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[40],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [40])&local_68,
             (shared_ptr<oout::CtorExceptionText<WithException>_> *)
             "CtorExceptionText pass args to CUT ctor",&local_78);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_28,&local_38,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_001cbde8;
  return;
}

Assistant:

CtorExceptionTextTest::CtorExceptionTextTest()
: dirty::Test(
	"Exception in ctor represent as a text",
	make_shared<const NamedTest>(
		"CtorExceptionText is a exception message",
		make_shared<CtorExceptionText<WithException>>(),
		make_shared<EqualMatch>("shit happen")
	),
	make_shared<const NamedTest>(
		"CtorExceptionText pass args to CUT ctor",
		make_shared<CtorExceptionText<WithException>>("argument"),
		make_shared<EqualMatch>("argument")
	)
)
{
}